

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O1

void Cec2_ManSaveCis(Gia_Man_t *p)

{
  Vec_Wrd_t *pVVar1;
  word wVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  word *pwVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  if (p->vSimsPi == (Vec_Wrd_t *)0x0) {
    __assert_fail("p->vSimsPi != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                  ,0x1fa,"void Cec2_ManSaveCis(Gia_Man_t *)");
  }
  if (0 < p->nSimWords) {
    lVar7 = 0;
    do {
      pVVar4 = p->vCis;
      if (0 < pVVar4->nSize) {
        lVar8 = 0;
        do {
          iVar6 = pVVar4->pArray[lVar8];
          if ((iVar6 < 0) || (p->nObjs <= iVar6)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (iVar6 == 0) break;
          uVar3 = iVar6 * p->nSimWords;
          if (((int)uVar3 < 0) || (p->vSims->nSize <= (int)uVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
          pVVar1 = p->vSimsPi;
          wVar2 = p->vSims->pArray[(ulong)uVar3 + lVar7];
          uVar3 = pVVar1->nCap;
          if (pVVar1->nSize == uVar3) {
            if ((int)uVar3 < 0x10) {
              if (pVVar1->pArray == (word *)0x0) {
                pwVar5 = (word *)malloc(0x80);
              }
              else {
                pwVar5 = (word *)realloc(pVVar1->pArray,0x80);
              }
              pVVar1->pArray = pwVar5;
              iVar6 = 0x10;
            }
            else {
              iVar6 = uVar3 * 2;
              if (iVar6 <= (int)uVar3) goto LAB_006463f7;
              if (pVVar1->pArray == (word *)0x0) {
                pwVar5 = (word *)malloc((ulong)uVar3 << 4);
              }
              else {
                pwVar5 = (word *)realloc(pVVar1->pArray,(ulong)uVar3 << 4);
              }
              pVVar1->pArray = pwVar5;
            }
            if (pwVar5 == (word *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                            ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
            }
            pVVar1->nCap = iVar6;
          }
LAB_006463f7:
          iVar6 = pVVar1->nSize;
          pVVar1->nSize = iVar6 + 1;
          pVVar1->pArray[iVar6] = wVar2;
          lVar8 = lVar8 + 1;
          pVVar4 = p->vCis;
        } while (lVar8 < pVVar4->nSize);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < p->nSimWords);
  }
  return;
}

Assistant:

void Cec2_ManSaveCis( Gia_Man_t * p )
{
    int w, i, Id;
    assert( p->vSimsPi != NULL );
    for ( w = 0; w < p->nSimWords; w++ )
        Gia_ManForEachCiId( p, Id, i )
            Vec_WrdPush( p->vSimsPi, Cec2_ObjSim(p, Id)[w] );
}